

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixxx.cc
# Opt level: O0

void __thiscall ixxx::ansi::noenv::test_method(noenv *this)

{
  undefined8 uVar1;
  bool bVar2;
  char *__s;
  lazy_ostream *prev;
  undefined1 local_121;
  basic_cstring<const_char> local_120;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_110;
  basic_cstring<const_char> local_e8;
  basic_cstring<const_char> local_d8 [9];
  getenv_error *e;
  string local_38 [8];
  string s;
  bool caught;
  noenv *this_local;
  
  s.field_2._M_local_buf[0xf] = '\0';
  __s = getenv("DOESNOTEXISTNOTEXIST");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,__s,(allocator<char> *)((long)&e + 3))
  ;
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 3));
  std::__cxx11::string::~string(local_38);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_d8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/gsauthof[P]libixxx/unittest/ixxx.cc"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_e8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,local_d8,0x7c,&local_e8);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_110,prev,(char (*) [1])"");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_120,
               "/workspace/llm4binary/github/license_all_cmakelists_25/gsauthof[P]libixxx/unittest/ixxx.cc"
               ,0x5a);
    local_121 = 1;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (&local_110,&local_120,0x7c,1,2,(undefined1 *)((long)&s.field_2 + 0xf),"caught",
               &local_121,"true");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_110);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( noenv )
    {
      bool caught = false;
      try {
        string s(ansi::getenv("DOESNOTEXISTNOTEXIST"));
      } catch (getenv_error &e) {
        caught = true;
        BOOST_CHECK(e.function() == Function::GETENV);
      }
      BOOST_CHECK_EQUAL(caught, true);
    }